

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

Fraig_Node_t * Fraig_HashTableLookupF(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  Fraig_HashTable_t *p;
  Fraig_Node_t *pNode2;
  int iVar1;
  Fraig_Node_t **ppFVar2;
  ulong uVar3;
  Fraig_Node_t *pNode2_00;
  
  p = pMan->pTableF;
  uVar3 = (ulong)pNode->uHashR % (ulong)(uint)p->nBins;
  ppFVar2 = p->pBins + uVar3;
  while( true ) {
    pNode2 = *ppFVar2;
    if (pNode2 == (Fraig_Node_t *)0x0) {
      iVar1 = p->nEntries;
      if (p->nBins * 2 <= iVar1) {
        Fraig_TableResizeF(p,1);
        uVar3 = (ulong)pNode->uHashR % (ulong)(uint)p->nBins;
        iVar1 = p->nEntries;
      }
      ppFVar2 = p->pBins;
      pNode->pNextF = ppFVar2[uVar3];
      ppFVar2[uVar3] = pNode;
      p->nEntries = iVar1 + 1;
      return (Fraig_Node_t *)0x0;
    }
    iVar1 = Fraig_CompareSimInfo(pNode,pNode2,pMan->nWordsRand,1);
    pNode2_00 = pNode2;
    if (iVar1 != 0) break;
    ppFVar2 = &pNode2->pNextF;
  }
  while( true ) {
    if (pNode2_00 == (Fraig_Node_t *)0x0) {
      pNode->pNextD = pNode2->pNextD;
      pNode2->pNextD = pNode;
      return (Fraig_Node_t *)0x0;
    }
    iVar1 = Fraig_CompareSimInfo(pNode,pNode2_00,pMan->iWordStart,0);
    if (iVar1 != 0) break;
    pNode2_00 = pNode2_00->pNextD;
  }
  return pNode2_00;
}

Assistant:

Fraig_Node_t * Fraig_HashTableLookupF( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    Fraig_HashTable_t * p = pMan->pTableF;
    Fraig_Node_t * pEnt, * pEntD;
    unsigned Key;

    // go through the hash table entries
    Key = pNode->uHashR % p->nBins;
    Fraig_TableBinForEachEntryF( p->pBins[Key], pEnt )
    {
        // if their simulation info differs, skip
        if ( !Fraig_CompareSimInfo( pNode, pEnt, pMan->nWordsRand, 1 ) )
            continue;
        // equivalent up to the complement
        Fraig_TableBinForEachEntryD( pEnt, pEntD )
        {
            // if their simulation info differs, skip
            if ( !Fraig_CompareSimInfo( pNode, pEntD, pMan->iWordStart, 0 ) )
                continue;
            // found a simulation-equivalent node
            return pEntD; 
        }
        // did not find a simulation equivalent node
        // add the node to the corresponding linked list
        pNode->pNextD = pEnt->pNextD;
        pEnt->pNextD  = pNode;
        // return NULL, because there is no functional equivalence in this case
        return NULL;
    }

    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeF( p, 1 );
        Key = pNode->uHashR % p->nBins;
    }

    // add the node to the corresponding linked list in the table
    pNode->pNextF = p->pBins[Key];
    p->pBins[Key] = pNode;
    p->nEntries++;
    // return NULL, because there is no functional equivalence in this case
    return NULL;
}